

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLSSetJacEvalFrequency(void *arkode_mem,long msbj)

{
  ARKodeMem in_RSI;
  int retval;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKodeMem local_38;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ARKodeMem *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  int local_4;
  
  local_38 = in_RSI;
  local_4 = arkLs_AccessLMem(in_RSI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                             (ARKLsMem *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (local_4 == 0) {
    if ((double)(long)local_38 <= 0.0) {
      local_38 = (ARKodeMem)0x33;
    }
    in_stack_ffffffffffffffd8[0xe] = local_38;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkLSSetJacEvalFrequency(void *arkode_mem, long int msbj)
{
  ARKodeMem ark_mem;
  ARKLsMem  arkls_mem;
  int       retval;

  /* access ARKLsMem structure; store input and return */
  retval = arkLs_AccessLMem(arkode_mem, "arkLSSetJacEvalFrequency",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);
  arkls_mem->msbj = (msbj <= ZERO) ? ARKLS_MSBJ : msbj;

  return(ARKLS_SUCCESS);
}